

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

EventTriggerStatementSyntax * __thiscall
slang::parsing::Parser::parseEventTriggerStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  SourceRange range;
  Token trigger_00;
  Token semi;
  NameSyntax *pNVar1;
  EventTriggerStatementSyntax *pEVar2;
  TimingControlSyntax *in_RDI;
  Token TVar3;
  NameSyntax *name;
  TimingControlSyntax *timing;
  SyntaxKind kind;
  Token trigger;
  bool in_stack_000001f7;
  Parser *in_stack_000001f8;
  Parser *in_stack_fffffffffffffef0;
  pointer in_stack_fffffffffffffef8;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff00;
  ParserBase *in_stack_ffffffffffffff08;
  SyntaxKind kind_00;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  SourceLocation in_stack_ffffffffffffff18;
  undefined4 uVar4;
  DiagCode in_stack_ffffffffffffff24;
  undefined4 uVar5;
  SyntaxNode *in_stack_ffffffffffffff40;
  TokenKind in_stack_ffffffffffffff7e;
  ParserBase *in_stack_ffffffffffffff80;
  TimingControlSyntax *local_40;
  undefined4 local_34;
  Info *local_30;
  
  TVar3 = ParserBase::consume((ParserBase *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_34 = 0x38;
  local_40 = (TimingControlSyntax *)0x0;
  local_30._0_2_ = TVar3.kind;
  if ((TokenKind)local_30 == MinusDoubleArrow) {
    local_34 = 0x14c;
    local_40 = parseTimingControl(in_stack_000001f8,in_stack_000001f7);
    if ((local_40 != (TimingControlSyntax *)0x0) &&
       ((local_40->super_SyntaxNode).kind == CycleDelay)) {
      slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff40);
      range.startLoc._4_4_ = in_stack_ffffffffffffff14;
      range.startLoc._0_4_ = in_stack_ffffffffffffff10;
      range.endLoc = in_stack_ffffffffffffff18;
      ParserBase::addDiag(in_stack_ffffffffffffff08,in_stack_ffffffffffffff24,range);
    }
  }
  pNVar1 = parseName(in_stack_fffffffffffffef0);
  kind_00 = (SyntaxKind)((ulong)&in_RDI[9].super_SyntaxNode.parent >> 0x20);
  elements._M_extent._M_extent_value = in_stack_ffffffffffffff00._M_extent_value;
  elements._M_ptr = in_stack_fffffffffffffef8;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffef0,
             elements);
  local_30 = TVar3._0_8_;
  uVar4 = SUB84(pNVar1,0);
  uVar5 = (undefined4)((ulong)pNVar1 >> 0x20);
  TVar3 = ParserBase::expect(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
  trigger_00.info._0_4_ = uVar4;
  trigger_00._0_8_ = local_40;
  trigger_00.info._4_4_ = uVar5;
  semi.info = local_30;
  semi._0_8_ = (NamedLabelSyntax *)TVar3.info;
  pEVar2 = slang::syntax::SyntaxFactory::eventTriggerStatement
                     ((SyntaxFactory *)CONCAT44(local_34,in_stack_ffffffffffffff10),kind_00,
                      (NamedLabelSyntax *)TVar3.info,TVar3._0_8_,trigger_00,in_RDI,
                      (NameSyntax *)TVar3._0_8_,semi);
  return pEVar2;
}

Assistant:

EventTriggerStatementSyntax& Parser::parseEventTriggerStatement(NamedLabelSyntax* label,
                                                                AttrList attributes) {
    auto trigger = consume();

    SyntaxKind kind = SyntaxKind::BlockingEventTriggerStatement;
    TimingControlSyntax* timing = nullptr;
    if (trigger.kind == TokenKind::MinusDoubleArrow) {
        kind = SyntaxKind::NonblockingEventTriggerStatement;
        timing = parseTimingControl();
        if (timing && timing->kind == SyntaxKind::CycleDelay)
            addDiag(diag::EventTriggerCycleDelay, timing->sourceRange());
    }

    auto& name = parseName();
    return factory.eventTriggerStatement(kind, label, attributes, trigger, timing, name,
                                         expect(TokenKind::Semicolon));
}